

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O1

bool __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::isMeshInterfaceVar
          (BuiltInsValidator *this,Instruction *inst)

{
  uint32_t uVar1;
  _Base_ptr p_Var2;
  uint32_t *puVar3;
  uint id;
  int iVar4;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *psVar5;
  _Rb_tree_header *p_Var6;
  mapped_type *pmVar7;
  Instruction *pIVar8;
  _Base_ptr p_Var9;
  pointer pEVar10;
  _Base_ptr p_Var11;
  uint32_t *puVar12;
  size_t index;
  ValidationState_t *this_00;
  uint32_t *puVar13;
  bool bVar14;
  bool local_61;
  uint32_t local_54;
  uint32_t *local_50;
  uint32_t *local_48;
  pointer local_40;
  uint32_t *local_38;
  
  local_48 = (this->_->entry_points_).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_50 = (this->_->entry_points_).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_61 = local_48 != local_50;
  if (local_61) {
    do {
      uVar1 = *local_48;
      psVar5 = ValidationState_t::GetExecutionModels(this->_,uVar1);
      p_Var6 = &(psVar5->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (psVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var9 = p_Var2;
      p_Var11 = &p_Var6->_M_header;
      for (; p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[bVar14]) {
        bVar14 = p_Var9[1]._M_color < 0x14f5;
        if (!bVar14) {
          p_Var11 = p_Var9;
        }
      }
      p_Var9 = &p_Var6->_M_header;
      if (((_Rb_tree_header *)p_Var11 != p_Var6) && (p_Var9 = p_Var11, 0x14f5 < p_Var11[1]._M_color)
         ) {
        p_Var9 = &p_Var6->_M_header;
      }
      p_Var11 = &p_Var6->_M_header;
      if ((_Rb_tree_header *)p_Var9 == p_Var6) {
        for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[bVar14]) {
          bVar14 = p_Var2[1]._M_color < 0x1494;
          if (!bVar14) {
            p_Var11 = p_Var2;
          }
        }
        p_Var9 = &p_Var6->_M_header;
        if (((_Rb_tree_header *)p_Var11 != p_Var6) &&
           (p_Var9 = p_Var11, 0x1494 < p_Var11[1]._M_color)) {
          p_Var9 = &p_Var6->_M_header;
        }
        if ((_Rb_tree_header *)p_Var9 != p_Var6) goto LAB_0064927c;
LAB_0064936e:
        iVar4 = 0;
      }
      else {
LAB_0064927c:
        local_54 = uVar1;
        pmVar7 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&this->_->entry_point_descriptions_,&local_54);
        pEVar10 = (pmVar7->
                  super__Vector_base<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_40 = (pmVar7->
                   super__Vector_base<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        if (pEVar10 != local_40) {
          do {
            puVar13 = (pEVar10->interfaces).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar12 = (pEVar10->interfaces).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            iVar4 = 0;
            bVar14 = puVar13 == puVar12;
            puVar3 = puVar12;
            if (!bVar14) {
              do {
                local_38 = puVar3;
                if ((inst->inst_).opcode == 0x1e) {
                  pIVar8 = ValidationState_t::FindDef(this->_,*puVar13);
                  uVar1 = (inst->inst_).result_id;
                  pIVar8 = ValidationState_t::FindDef(this->_,(pIVar8->inst_).type_id);
                  this_00 = this->_;
                  index = 2;
                  while( true ) {
                    id = Instruction::GetOperandAs<unsigned_int>(pIVar8,index);
                    pIVar8 = ValidationState_t::FindDef(this_00,id);
                    if ((pIVar8->inst_).opcode != 0x1c) break;
                    this_00 = this->_;
                    index = 1;
                  }
                  puVar12 = local_38;
                  if (uVar1 == (pIVar8->inst_).result_id) {
LAB_00649345:
                    iVar4 = 1;
                    goto LAB_0064934f;
                  }
                }
                else if ((inst->inst_).result_id == *puVar13) goto LAB_00649345;
                puVar13 = puVar13 + 1;
                bVar14 = puVar13 == puVar12;
                puVar3 = local_38;
              } while (!bVar14);
              iVar4 = 0;
            }
LAB_0064934f:
            if (!bVar14) goto LAB_00649369;
            pEVar10 = pEVar10 + 1;
          } while (pEVar10 != local_40);
        }
        iVar4 = 4;
LAB_00649369:
        if (iVar4 == 4) goto LAB_0064936e;
      }
      if (iVar4 != 0) {
        return local_61;
      }
      local_48 = local_48 + 1;
      local_61 = local_48 != local_50;
    } while (local_61);
  }
  return local_61;
}

Assistant:

bool isMeshInterfaceVar(const Instruction& inst) {
    auto getUnderlyingTypeId = [&](const Instruction* ifxVar) {
      auto pointerTypeInst = _.FindDef(ifxVar->type_id());
      auto typeInst = _.FindDef(pointerTypeInst->GetOperandAs<uint32_t>(2));
      while (typeInst->opcode() == spv::Op::OpTypeArray) {
        typeInst = _.FindDef(typeInst->GetOperandAs<uint32_t>(1));
      };
      return typeInst->id();
    };

    for (const uint32_t entry_point : _.entry_points()) {
      const auto* models = _.GetExecutionModels(entry_point);
      if (models->find(spv::ExecutionModel::MeshEXT) != models->end() ||
          models->find(spv::ExecutionModel::MeshNV) != models->end()) {
        for (const auto& desc : _.entry_point_descriptions(entry_point)) {
          for (auto interface : desc.interfaces) {
            if (inst.opcode() == spv::Op::OpTypeStruct) {
              auto varInst = _.FindDef(interface);
              if (inst.id() == getUnderlyingTypeId(varInst)) return true;
            } else if (inst.id() == interface) {
              return true;
            }
          }
        }
      }
    }
    return false;
  }